

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O3

int32 read_tree_int(FILE *fp,char *name,int32 *out,int32 optional)

{
  uint uVar1;
  int iVar2;
  char line [256];
  
  uVar1 = __isoc99_fscanf(fp,"%255s %d",line,out);
  if ((optional != 0 || uVar1 == 2) && (iVar2 = strcmp(line,name), iVar2 == 0)) {
    return uVar1;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kdtree.c"
          ,0x47,"%s not found: %d %s %d\n",name,(ulong)uVar1,line,out);
  return -1;
}

Assistant:

static int32
read_tree_int(FILE * fp, const char *name, int32 * out, int32 optional)
{
    char line[256];
    int n;

    n = fscanf(fp, "%255s %d", line, out);
    if ((optional == 0 && n != 2) || strcmp(line, name)) {
        E_ERROR("%s not found: %d %s %d\n", name, n, line, out);
        return -1;
    }
    return n;
}